

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_usable(REF_GEOM ref_geom,REF_INT geom,REF_BOOL *usable)

{
  uint uVar1;
  REF_STATUS RVar2;
  uint uVar3;
  REF_DBL RVar4;
  REF_DBL RVar5;
  REF_DBL kr;
  REF_DBL local_1d0;
  REF_DBL local_1c8;
  REF_DBL ks;
  REF_DBL ks0;
  REF_DBL kr0;
  REF_DBL duvdrs [4];
  REF_DBL uv [2];
  REF_DBL s [3];
  REF_DBL r [3];
  REF_DBL s0 [3];
  REF_DBL r0 [3];
  REF_DBL dxyz_dtuv [15];
  REF_DBL xyz0 [3];
  REF_DBL drsduv [4];
  
  *usable = 0;
  if (geom < 0) {
    return 3;
  }
  if (ref_geom->max <= geom) {
    return 3;
  }
  uVar1 = geom * 6;
  if (ref_geom->descr[uVar1] == 2) {
    local_1d0 = ref_geom->param[(uint)(geom * 2)];
    local_1c8 = ref_geom->param[(ulong)(uint)(geom * 2) + 1];
    RVar2 = ref_egads_face_curvature(ref_geom,geom,&kr0,r0,&ks0,s0);
    if (RVar2 != 0) {
LAB_00183397:
      *usable = 0;
      return 0;
    }
    RVar4 = kr0;
    if (kr0 <= -kr0) {
      RVar4 = -kr0;
    }
    if (RVar4 < 1.0) {
      RVar4 = ks0;
      if (ks0 <= -ks0) {
        RVar4 = -ks0;
      }
      if (RVar4 < 1.0) goto LAB_001833df;
    }
    uVar3 = ref_egads_eval(ref_geom,geom,xyz0,dxyz_dtuv);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x9ca,
             "ref_geom_usable",(ulong)uVar3,"eval edge");
      return uVar3;
    }
    drsduv[0] = dxyz_dtuv[2] * r0[2] + dxyz_dtuv[0] * r0[0] + dxyz_dtuv[1] * r0[1];
    drsduv[1] = dxyz_dtuv[2] * s0[2] + dxyz_dtuv[0] * s0[0] + dxyz_dtuv[1] * s0[1];
    drsduv[2] = r0[2] * dxyz_dtuv[5] + r0[0] * dxyz_dtuv[3] + r0[1] * dxyz_dtuv[4];
    drsduv[3] = dxyz_dtuv[5] * s0[2] + dxyz_dtuv[3] * s0[0] + s0[1] * dxyz_dtuv[4];
    RVar2 = ref_matrix_inv_gen(2,drsduv,duvdrs);
    if (RVar2 != 0) goto LAB_00183397;
    RVar4 = kr0;
    if (kr0 <= -kr0) {
      RVar4 = -kr0;
    }
    if (1.0 < RVar4) {
      uv[0] = duvdrs[0] * (0.1 / RVar4) + duvdrs[2] * 0.0 + local_1d0;
      uv[1] = (0.1 / RVar4) * duvdrs[1] + duvdrs[3] * 0.0 + local_1c8;
      RVar2 = ref_egads_face_curvature_at
                        (ref_geom,ref_geom->descr[uVar1 | 1],ref_geom->descr[(ulong)uVar1 + 4],uv,
                         &kr,r,&ks,s);
      if (RVar2 != 0) {
        return 0;
      }
      RVar4 = kr;
      if (kr <= -kr) {
        RVar4 = -kr;
      }
      RVar5 = kr0;
      if (kr0 <= -kr0) {
        RVar5 = -kr0;
      }
      if ((RVar4 < RVar5 * 0.1) || (RVar5 * 10.0 < RVar4)) goto LAB_0018392d;
      uv[0] = duvdrs[0] * (-0.1 / RVar5) + duvdrs[2] * 0.0 + local_1d0;
      uv[1] = (-0.1 / RVar5) * duvdrs[1] + duvdrs[3] * 0.0 + local_1c8;
      RVar2 = ref_egads_face_curvature_at
                        (ref_geom,ref_geom->descr[uVar1 | 1],ref_geom->descr[(ulong)uVar1 + 4],uv,
                         &kr,r,&ks,s);
      if (RVar2 != 0) {
        return 0;
      }
      if (kr <= -kr) {
        kr = -kr;
      }
      if (kr0 <= -kr0) {
        kr0 = -kr0;
      }
      if ((kr < kr0 * 0.1) || (kr0 * 10.0 < kr)) goto LAB_0018392d;
    }
    RVar4 = ks0;
    if (ks0 <= -ks0) {
      RVar4 = -ks0;
    }
    if (1.0 < RVar4) {
      uv[0] = duvdrs[0] * 0.0 + duvdrs[2] * (0.1 / ks0) + local_1d0;
      uv[1] = duvdrs[1] * 0.0 + (0.1 / ks0) * duvdrs[3] + local_1c8;
      RVar2 = ref_egads_face_curvature_at
                        (ref_geom,ref_geom->descr[uVar1 | 1],ref_geom->descr[(ulong)uVar1 + 4],uv,
                         &kr,r,&ks,s);
      if (RVar2 != 0) {
        return 0;
      }
      RVar4 = ks;
      if (ks <= -ks) {
        RVar4 = -ks;
      }
      RVar5 = ks0;
      if (ks0 <= -ks0) {
        RVar5 = -ks0;
      }
      if ((RVar5 * 0.1 <= RVar4) && (RVar4 <= RVar5 * 10.0)) {
        uv[0] = local_1d0 + duvdrs[0] * 0.0 + duvdrs[2] * (-0.1 / ks0);
        uv[1] = local_1c8 + duvdrs[1] * 0.0 + (-0.1 / ks0) * duvdrs[3];
        RVar2 = ref_egads_face_curvature_at
                          (ref_geom,ref_geom->descr[uVar1 | 1],ref_geom->descr[(ulong)uVar1 + 4],uv,
                           &kr,r,&ks,s);
        if (RVar2 != 0) {
          return 0;
        }
        if (ks <= -ks) {
          ks = -ks;
        }
        if (ks0 <= -ks0) {
          ks0 = -ks0;
        }
        if ((ks0 * 0.1 <= ks) && (ks <= ks0 * 10.0)) goto LAB_001833df;
      }
LAB_0018392d:
      *usable = 0;
      return 0;
    }
  }
LAB_001833df:
  *usable = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_usable(REF_GEOM ref_geom, REF_INT geom,
                                   REF_BOOL *usable) {
  REF_DBL kr0, r0[3], ks0, s0[3];
  REF_DBL curvature_is_ok = 1.0;
  REF_DBL uv0[2], xyz0[3], dxyz_dtuv[15];
  REF_DBL h, delta_radian = 0.1; /* 10 segment per radian of curvature */
  REF_DBL drsduv[4], duvdrs[4];
  REF_DBL duv[2], drs[2];
  REF_DBL uv[2];
  REF_DBL kr, r[3], ks, s[3];
  REF_DBL kmin = 0.1, kmax = 10.0;
  REF_BOOL verbose = REF_FALSE;
  *usable = REF_FALSE;
  if (geom < 0 || ref_geom_max(ref_geom) <= geom) return REF_INVALID;

  if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
    uv0[0] = ref_geom_param(ref_geom, 0, geom); /* ignores periodic */
    uv0[1] = ref_geom_param(ref_geom, 1, geom);

    if (REF_SUCCESS !=
        ref_egads_face_curvature(ref_geom, geom, &kr0, r0, &ks0, s0)) {
      *usable = REF_FALSE;
      return REF_SUCCESS;
    }

    if (ABS(kr0) < curvature_is_ok && ABS(ks0) < curvature_is_ok) {
      *usable = REF_TRUE;
      return REF_SUCCESS;
    }

    RSS(ref_egads_eval(ref_geom, geom, xyz0, dxyz_dtuv), "eval edge");
    /* [x_u,y_u,z_u] [x_v,y_v,z_v] */
    /*  drsduv = [r s] * dxyz_dtuv */
    drsduv[0] =
        dxyz_dtuv[0] * r0[0] + dxyz_dtuv[1] * r0[1] + dxyz_dtuv[2] * r0[2];
    drsduv[1] =
        dxyz_dtuv[0] * s0[0] + dxyz_dtuv[1] * s0[1] + dxyz_dtuv[2] * s0[2];
    drsduv[2] =
        dxyz_dtuv[3] * r0[0] + dxyz_dtuv[4] * r0[1] + dxyz_dtuv[5] * r0[2];
    drsduv[3] =
        dxyz_dtuv[3] * s0[0] + dxyz_dtuv[4] * s0[1] + dxyz_dtuv[5] * s0[2];
    if (REF_SUCCESS != ref_matrix_inv_gen(2, drsduv, duvdrs)) {
      *usable = REF_FALSE;
      return REF_SUCCESS;
    }

    if (ABS(kr0) > curvature_is_ok) {
      /* find points +/- h from xyz0 along r */
      h = delta_radian / ABS(kr0);
      drs[0] = h;
      drs[1] = 0.0;
      duv[0] = duvdrs[0] * drs[0] + duvdrs[2] * drs[1];
      duv[1] = duvdrs[1] * drs[0] + duvdrs[3] * drs[1];
      uv[0] = uv0[0] + duv[0];
      uv[1] = uv0[1] + duv[1];
      if (REF_SUCCESS !=
          ref_egads_face_curvature_at(ref_geom, ref_geom_id(ref_geom, geom),
                                      ref_geom_degen(ref_geom, geom), uv, &kr,
                                      r, &ks, s))
        return REF_SUCCESS;
      if (ABS(kr) < kmin * ABS(kr0) || kmax * ABS(kr0) < ABS(kr)) {
        if (verbose) printf("kr0 %f kr+ %f\n", kr0, kr);
        *usable = REF_FALSE;
        return REF_SUCCESS;
      }
      h = delta_radian / ABS(kr0);
      drs[0] = -h;
      drs[1] = 0.0;
      duv[0] = duvdrs[0] * drs[0] + duvdrs[2] * drs[1];
      duv[1] = duvdrs[1] * drs[0] + duvdrs[3] * drs[1];
      uv[0] = uv0[0] + duv[0];
      uv[1] = uv0[1] + duv[1];
      if (REF_SUCCESS !=
          ref_egads_face_curvature_at(ref_geom, ref_geom_id(ref_geom, geom),
                                      ref_geom_degen(ref_geom, geom), uv, &kr,
                                      r, &ks, s))
        return REF_SUCCESS;
      if (ABS(kr) < kmin * ABS(kr0) || kmax * ABS(kr0) < ABS(kr)) {
        if (verbose) printf("kr0 %f kr- %f\n", kr0, kr);
        *usable = REF_FALSE;
        return REF_SUCCESS;
      }
    }
    if (ABS(ks0) > curvature_is_ok) {
      /* find points +/- h from xyz0 along s */
      h = delta_radian / ks0;
      drs[0] = 0.0;
      drs[1] = h;
      duv[0] = duvdrs[0] * drs[0] + duvdrs[2] * drs[1];
      duv[1] = duvdrs[1] * drs[0] + duvdrs[3] * drs[1];
      uv[0] = uv0[0] + duv[0];
      uv[1] = uv0[1] + duv[1];
      if (REF_SUCCESS !=
          ref_egads_face_curvature_at(ref_geom, ref_geom_id(ref_geom, geom),
                                      ref_geom_degen(ref_geom, geom), uv, &kr,
                                      r, &ks, s))
        return REF_SUCCESS;
      if (ABS(ks) < kmin * ABS(ks0) || kmax * ABS(ks0) < ABS(ks)) {
        if (verbose)
          printf("ks0 %f ks+ %f duv %f %f\n", ks0, ks, duv[0], duv[1]);
        *usable = REF_FALSE;
        return REF_SUCCESS;
      }
      if (verbose)
        printf("keep ks0 %f ks+ %f duv %f %f\n", ks0, ks, duv[0], duv[1]);
      h = delta_radian / ks0;
      drs[0] = 0.0;
      drs[1] = -h;
      duv[0] = duvdrs[0] * drs[0] + duvdrs[2] * drs[1];
      duv[1] = duvdrs[1] * drs[0] + duvdrs[3] * drs[1];
      uv[0] = uv0[0] + duv[0];
      uv[1] = uv0[1] + duv[1];
      if (REF_SUCCESS !=
          ref_egads_face_curvature_at(ref_geom, ref_geom_id(ref_geom, geom),
                                      ref_geom_degen(ref_geom, geom), uv, &kr,
                                      r, &ks, s))
        return REF_SUCCESS;
      if (ABS(ks) < kmin * ABS(ks0) || kmax * ABS(ks0) < ABS(ks)) {
        if (verbose)
          printf("ks0 %f ks- %f duv %f %f\n", ks0, ks, duv[0], duv[1]);
        *usable = REF_FALSE;
        return REF_SUCCESS;
      }
      if (verbose)
        printf("keep ks0 %f ks- %f duv %f %f\n", ks0, ks, duv[0], duv[1]);
    }
  }

  *usable = REF_TRUE;
  return REF_SUCCESS;
}